

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzsparseblockdiagonal.cpp
# Opt level: O2

void __thiscall
TPZSparseBlockDiagonal<double>::TPZSparseBlockDiagonal
          (TPZSparseBlockDiagonal<double> *this,void **vtt,TPZVec<long> *blockgraph,
          TPZVec<long> *blockgraphindex,int64_t rows,int color,TPZVec<int> *colors)

{
  TPZVec<int> *this_00;
  int *piVar1;
  long *plVar2;
  int *piVar3;
  long *plVar4;
  long lVar5;
  long *plVar6;
  int64_t iVar7;
  long lVar8;
  int iVar9;
  long *plVar10;
  long newsize;
  long lVar11;
  
  TPZBlockDiagonal<double>::TPZBlockDiagonal(&this->super_TPZBlockDiagonal<double>,vtt + 1);
  (this->super_TPZBlockDiagonal<double>).super_TPZMatrix<double>.super_TPZBaseMatrix.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)*vtt;
  (this->fBlock)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01649268;
  (this->fBlock).fStore = (long *)0x0;
  (this->fBlock).fNElements = 0;
  (this->fBlock).fNAlloc = 0;
  (this->fBlockIndex)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01649268;
  (this->fBlockIndex).fNAlloc = 0;
  (this->fBlockIndex).fStore = (long *)0x0;
  (this->fBlockIndex).fNElements = 0;
  newsize = blockgraphindex->fNElements + -1;
  this_00 = &(this->super_TPZBlockDiagonal<double>).fBlockSize;
  TPZVec<int>::Resize(this_00,newsize);
  piVar1 = colors->fStore;
  plVar2 = blockgraphindex->fStore;
  piVar3 = (this->super_TPZBlockDiagonal<double>).fBlockSize.fStore;
  lVar11 = 0;
  if (newsize < 1) {
    newsize = lVar11;
  }
  iVar7 = 0;
  for (lVar8 = 0; newsize != lVar8; lVar8 = lVar8 + 1) {
    if (piVar1[lVar8] == color) {
      iVar9 = (int)plVar2[lVar8 + 1] - (int)plVar2[lVar8];
      piVar3[lVar11] = iVar9;
      lVar11 = lVar11 + 1;
      iVar7 = iVar7 + iVar9;
    }
  }
  TPZVec<long>::Resize(&this->fBlock,iVar7);
  TPZVec<long>::Resize(&this->fBlockIndex,lVar11 + 1);
  plVar2 = (this->fBlockIndex).fStore;
  *plVar2 = 0;
  piVar1 = colors->fStore;
  plVar4 = blockgraphindex->fStore;
  piVar3 = (this->super_TPZBlockDiagonal<double>).fBlockSize.fStore;
  iVar7 = 0;
  for (lVar11 = 0; lVar11 != newsize; lVar11 = lVar11 + 1) {
    if (piVar1[lVar11] == color) {
      lVar8 = plVar4[lVar11];
      lVar5 = plVar4[lVar11 + 1];
      plVar10 = plVar2 + iVar7;
      plVar2[iVar7 + 1] = (long)piVar3[iVar7] + *plVar10;
      iVar7 = iVar7 + 1;
      plVar6 = blockgraph->fStore;
      plVar10 = (this->fBlock).fStore + *plVar10;
      for (; lVar8 < lVar5; lVar8 = lVar8 + 1) {
        *plVar10 = plVar6[lVar8];
        plVar10 = plVar10 + 1;
      }
    }
  }
  TPZVec<int>::Resize(this_00,iVar7);
  TPZBlockDiagonal<double>::Initialize(&this->super_TPZBlockDiagonal<double>,this_00);
  (this->super_TPZBlockDiagonal<double>).super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = rows;
  (this->super_TPZBlockDiagonal<double>).super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = rows;
  return;
}

Assistant:

TPZSparseBlockDiagonal<TVar>::TPZSparseBlockDiagonal(TPZVec<int64_t> &blockgraph, TPZVec<int64_t> &blockgraphindex,int64_t rows, int color, TPZVec<int> &colors) : TPZRegisterClassId(&TPZSparseBlockDiagonal::ClassId)
{
#ifdef PZ_LOG
	LOGPZ_DEBUG(logger, "Constructor of TPZSparseBlockDiagonal");
#endif
	int64_t numbl = blockgraphindex.NElements()-1;
	this->fBlockSize.Resize(numbl);
	int64_t ibl,iblcount,graphsize = 0;
	for(ibl=0, iblcount=0; ibl<numbl; ibl++)
	{
		if(colors[ibl]==color) 
		{
			this->fBlockSize[iblcount++] = blockgraphindex[ibl+1]-blockgraphindex[ibl];
			graphsize += this->fBlockSize[iblcount-1];
		}
	}
	fBlock.Resize(graphsize);
	fBlockIndex.Resize(iblcount+1);
	fBlockIndex[0] = 0;
	for(ibl=0, iblcount=0; ibl<numbl; ibl++)
	{
		if(colors[ibl]==color) 
		{
			int64_t first = blockgraphindex[ibl];
			int64_t last = blockgraphindex[ibl+1];
			int64_t firstcp = fBlockIndex[iblcount];
			this->fBlockIndex[iblcount+1] = firstcp+this->fBlockSize[iblcount];
			//      int lastcp = fBlockIndex[iblcount+1];
			int64_t ieq,ieqcp;
			for(ieq=first,ieqcp=firstcp; ieq<last; ieq++,ieqcp++)
			{
				fBlock[ieqcp] = blockgraph[ieq];
			}
			iblcount++;
		}
	}
	this->fBlockSize.Resize(iblcount);
	this->Initialize(this->fBlockSize);
	this->fRow = rows;
	this->fCol = rows;
}